

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_block.cpp
# Opt level: O0

void __thiscall
Block_GetTransaction_Test::Block_GetTransaction_Test(Block_GetTransaction_Test *this)

{
  Block_GetTransaction_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Block_GetTransaction_Test_009eb228;
  return;
}

Assistant:

TEST(Block, GetTransaction) {
  std::string block_hex = "00000030957958949bad814d1666ed0d4a005c8aed6b7fd56df5d12c81d584c71e5fae2dfe391f9150dcfb06d54d4eb6621672590bf46bed6893da825c076b841794cec5414e2660ffff7f200000000001020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000";
  Block block(block_hex);
  Txid txid("c5ce9417846b075c82da9368ed6bf40b59721662b64e4dd506fbdc50911f39fe");
  EXPECT_TRUE(block.ExistTxid(txid));
  EXPECT_FALSE(block.ExistTxid(Txid(
    "695eddd38e01b5f67f93d3dcbdca033e1d8fd3feaefbdbcc2a2bd1326a6b7be4")));
  EXPECT_EQ(
    "020000000001010000000000000000000000000000000000000000000000000000000000000000ffffffff0502d5000101ffffffff0200f9029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000000000266a24aa21a9ede2f61c3f71d1defd3fa999dfa36953755c690689799962b48bebd836974e8cf90120000000000000000000000000000000000000000000000000000000000000000000000000",
    block.GetTransaction(txid).GetHex()
  );
  EXPECT_EQ(1, block.GetTransactionCount());
  EXPECT_EQ(txid.GetHex(), block.GetTxid(0).GetHex());

  Block block2;
  EXPECT_FALSE(block2.IsValid());
  block2 = block;
  EXPECT_TRUE(block2.IsValid());
  EXPECT_EQ(block_hex, block2.GetHex());
  Block block3(block);
  EXPECT_EQ(block_hex, block3.GetData().GetHex());
  EXPECT_EQ(block.GetBlockHeader().prev_block_hash.GetHex(),
      block3.GetBlockHeader().prev_block_hash.GetHex());
}